

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SelectPrep(Parse *pParse,Select *p,NameContext *pOuterNC)

{
  sqlite3 *psVar1;
  sqlite3 *db;
  NameContext *pOuterNC_local;
  Select *p_local;
  Parse *pParse_local;
  
  if ((((p != (Select *)0x0) && (psVar1 = pParse->db, psVar1->mallocFailed == '\0')) &&
      ((p->selFlags & 0x20) == 0)) &&
     (((sqlite3SelectExpand(pParse,p), pParse->nErr == 0 && (psVar1->mallocFailed == '\0')) &&
      ((sqlite3ResolveSelectNames(pParse,p,pOuterNC), pParse->nErr == 0 &&
       (psVar1->mallocFailed == '\0')))))) {
    sqlite3SelectAddTypeInfo(pParse,p);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SelectPrep(
  Parse *pParse,         /* The parser context */
  Select *p,             /* The SELECT statement being coded. */
  NameContext *pOuterNC  /* Name context for container */
){
  sqlite3 *db;
  if( NEVER(p==0) ) return;
  db = pParse->db;
  if( db->mallocFailed ) return;
  if( p->selFlags & SF_HasTypeInfo ) return;
  sqlite3SelectExpand(pParse, p);
  if( pParse->nErr || db->mallocFailed ) return;
  sqlite3ResolveSelectNames(pParse, p, pOuterNC);
  if( pParse->nErr || db->mallocFailed ) return;
  sqlite3SelectAddTypeInfo(pParse, p);
}